

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O2

void __thiscall ON_SubDVertex::ClearSavedSubdivisionPoints(ON_SubDVertex *this)

{
  Internal_ClearInteriorCreaseVertexSharpnessForExperts(this);
  ClearSavedSurfacePoints(this);
  ON_SubDComponentBase::Internal_ClearSubdivisionPointAndSurfacePointFlags
            (&this->super_ON_SubDComponentBase);
  return;
}

Assistant:

void ON_SubDVertex::ClearSavedSubdivisionPoints() const
{
  // Dale Lear 2024 Feb 27 - Fix RH-80633
  // Unconditionally clear cached crease sector sharpness.
  this->Internal_ClearInteriorCreaseVertexSharpnessForExperts();
  // clear vertex specific limit point cache
  ClearSavedSurfacePoints();
  // clear general subdivision point cache
  ON_SubDComponentBase::Internal_ClearSubdivisionPointAndSurfacePointFlags();
}